

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall
CVmByteArraySource::CVmByteArraySource
          (CVmByteArraySource *this,vm_obj_id_t arr,long start_idx,long len)

{
  CVmObject *pCVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  long in_RCX;
  _func_int **in_RDX;
  undefined4 in_ESI;
  CVmDataSource *in_RDI;
  
  CVmDataSource::CVmDataSource(in_RDI);
  in_RDI->_vptr_CVmDataSource = (_func_int **)&PTR__CVmByteArraySource_00440278;
  in_RDI[6]._vptr_CVmDataSource = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[1]._vptr_CVmDataSource = in_ESI;
  pCVar1 = vm_objp(0);
  in_RDI[2]._vptr_CVmDataSource = (_func_int **)pCVar1;
  in_RDI[3]._vptr_CVmDataSource = in_RDX;
  in_RDI[4]._vptr_CVmDataSource = in_RDX;
  in_RDI[5]._vptr_CVmDataSource = (_func_int **)((long)in_RDX + in_RCX);
  pp_Var3 = in_RDI[5]._vptr_CVmDataSource;
  pp_Var2 = (_func_int **)CVmObjByteArray::get_element_count((CVmObjByteArray *)0x31ba77);
  if (pp_Var2 < pp_Var3) {
    pp_Var3 = (_func_int **)CVmObjByteArray::get_element_count((CVmObjByteArray *)0x31ba9b);
    in_RDI[5]._vptr_CVmDataSource = pp_Var3;
  }
  return;
}

Assistant:

CVmByteArraySource(VMG_ vm_obj_id_t arr, long start_idx, long len)
    {
        /* remember the array and globals */
        this->vmg = VMGLOB_ADDR;
        this->arr_id = arr;
        this->arr = (CVmObjByteArray *)vm_objp(vmg_ arr);

        /* remember our window */
        this->idx = start_idx;
        this->start_idx = start_idx;
        this->end_idx = start_idx + len;

        /* limit the window to the actual available size */
        if ((unsigned long)end_idx > this->arr->get_element_count())
            end_idx = this->arr->get_element_count();
    }